

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O1

char * __thiscall gl4cts::TextureBarrierTexelBlocksBase::fsh(TextureBarrierTexelBlocksBase *this)

{
  return 
  "#version 400 core\n#define NUM_TEXTURES 8\nuniform int blockSize;\nuniform int modulo;\nuniform usampler2D texInput[NUM_TEXTURES];\nout uvec4 fragOutput[NUM_TEXTURES];\nuvec4 func(uvec4 t0, uvec4 t1, uvec4 t2, uvec4 t3) {\n   return t0 + t1 + t2 + t3;\n}\nvoid main() {\n    ivec2 texelCoord = ivec2(gl_FragCoord.xy);\n    ivec2 blockCoord = texelCoord / blockSize;\n    ivec2 xOffset = ivec2(blockSize, 0);\n    ivec2 yOffset = ivec2(0, blockSize);\n    if (((blockCoord.x + blockCoord.y) % 2) == modulo) {\n        for (int i = 0; i < NUM_TEXTURES; ++i) {\n            fragOutput[i] = func(texelFetch(texInput[i], texelCoord + xOffset, 0),\n                                 texelFetch(texInput[i], texelCoord - xOffset, 0),\n                                 texelFetch(texInput[i], texelCoord + yOffset, 0),\n                                 texelFetch(texInput[i], texelCoord - yOffset, 0));\n        }\n    } else {\n        discard;\n    }\n}"
  ;
}

Assistant:

virtual const char* fsh()
	{
		return "#version 400 core\n"
			   "#define NUM_TEXTURES 8\n"
			   "uniform int blockSize;\n"
			   "uniform int modulo;\n"
			   "uniform usampler2D texInput[NUM_TEXTURES];\n"
			   "out uvec4 fragOutput[NUM_TEXTURES];\n"
			   "uvec4 func(uvec4 t0, uvec4 t1, uvec4 t2, uvec4 t3) {\n"
			   "   return t0 + t1 + t2 + t3;\n"
			   "}\n"
			   "void main() {\n"
			   "    ivec2 texelCoord = ivec2(gl_FragCoord.xy);\n"
			   "    ivec2 blockCoord = texelCoord / blockSize;\n"
			   "    ivec2 xOffset = ivec2(blockSize, 0);\n"
			   "    ivec2 yOffset = ivec2(0, blockSize);\n"
			   "    if (((blockCoord.x + blockCoord.y) % 2) == modulo) {\n"
			   "        for (int i = 0; i < NUM_TEXTURES; ++i) {\n"
			   "            fragOutput[i] = func(texelFetch(texInput[i], texelCoord + xOffset, 0),\n"
			   "                                 texelFetch(texInput[i], texelCoord - xOffset, 0),\n"
			   "                                 texelFetch(texInput[i], texelCoord + yOffset, 0),\n"
			   "                                 texelFetch(texInput[i], texelCoord - yOffset, 0));\n"
			   "        }\n"
			   "    } else {\n"
			   "        discard;\n"
			   "    }\n"
			   "}";
	}